

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_lora_mm(llm_graph_context *this,ggml_tensor *w,ggml_tensor *cur)

{
  ggml_tensor *pgVar1;
  bool bVar2;
  reference pvVar3;
  llama_adapter_lora_weight *this_00;
  undefined8 uVar4;
  undefined8 in_RDX;
  ggml_tensor *in_RSI;
  llama_adapter_lora *in_RDI;
  float fVar5;
  ggml_tensor *ab_cur;
  float scale;
  float adapter_scale;
  llama_adapter_lora_weight *lw;
  value_type *lora;
  const_iterator __end1;
  const_iterator __begin1;
  llama_adapter_loras *__range1;
  ggml_tensor *res;
  unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
  *in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> local_38;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> local_30;
  __buckets_ptr local_28;
  ggml_tensor *local_20;
  undefined8 local_18;
  llama_adapter_lora *this_01;
  
  local_18 = in_RDX;
  this_01 = in_RDI;
  local_20 = (ggml_tensor *)
             ggml_mul_mat(in_RDI[1].bufs.
                          super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,in_RSI,in_RDX);
  local_28 = in_RDI[2].ab_map._M_h._M_buckets;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
       ::begin(in_stack_ffffffffffffff88);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
       ::end(in_stack_ffffffffffffff88);
  while (bVar2 = std::__detail::operator!=(&local_30,&local_38), bVar2) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>
                        *)0x432cfc);
    this_00 = llama_adapter_lora::get_weight(this_01,in_RSI);
    if (this_00 != (llama_adapter_lora_weight *)0x0) {
      fVar5 = llama_adapter_lora_weight::get_scale(this_00,pvVar3->first->alpha,pvVar3->second);
      in_stack_ffffffffffffff90 =
           in_RDI[1].bufs.
           super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pgVar1 = this_00->b;
      uVar4 = ggml_mul_mat(in_RDI[1].bufs.
                           super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,this_00->a,local_18);
      uVar4 = ggml_mul_mat(in_stack_ffffffffffffff90,pgVar1,uVar4);
      uVar4 = ggml_scale(fVar5,in_RDI[1].bufs.
                               super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,uVar4);
      local_20 = (ggml_tensor *)
                 ggml_add(in_RDI[1].bufs.
                          super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_20,uVar4);
    }
    std::__detail::_Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false> *)
               in_stack_ffffffffffffff90);
  }
  return local_20;
}

Assistant:

ggml_tensor * llm_graph_context::build_lora_mm(
          ggml_tensor * w,
          ggml_tensor * cur) const {
    ggml_tensor * res = ggml_mul_mat(ctx0, w, cur);

    for (const auto & lora : *loras) {
        llama_adapter_lora_weight * lw = lora.first->get_weight(w);
        if (lw == nullptr) {
            continue;
        }

        const float adapter_scale = lora.second;
        const float scale = lw->get_scale(lora.first->alpha, adapter_scale);

        ggml_tensor * ab_cur = ggml_mul_mat(
                ctx0, lw->b,
                ggml_mul_mat(ctx0, lw->a, cur)
                );

        ab_cur = ggml_scale(ctx0, ab_cur, scale);
        res = ggml_add(ctx0, res, ab_cur);
    }

    return res;
}